

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

void flush_to(PtrList *b,void **buffer,int *nbuf)

{
  int iVar1;
  long lVar2;
  
  if ((int)*(char *)b <= *nbuf) {
    lVar2 = (long)(int)*(char *)b;
    memcpy(b->list_,buffer,lVar2 * 8);
    iVar1 = *nbuf;
    *nbuf = (int)(iVar1 - lVar2);
    memmove(buffer,buffer + lVar2,(iVar1 - lVar2) * 8);
    return;
  }
  __assert_fail("*nbuf >= nr",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x1cc,"void flush_to(PtrList *, void **, int *)");
}

Assistant:

static void flush_to(PtrList *b, void **buffer, int *nbuf)
{
	int nr = b->nr_;
	assert(*nbuf >= nr);
	memcpy(b->list_, buffer, nr * sizeof(void *));
	*nbuf = *nbuf - nr;
	memmove(buffer, buffer + nr, *nbuf * sizeof(void *));
}